

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieCec.c
# Opt level: O2

void Abc_NtkDeriveFlatGia_rec(Gia_Man_t *pGia,Abc_Ntk_t *pNtk)

{
  undefined4 uVar1;
  Vec_Ptr_t *p;
  char *pSop;
  Abc_Ntk_t *pNtk_00;
  long *plVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  Abc_Obj_t *pAVar6;
  long *plVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  int gFanins [16];
  int local_78 [18];
  
  p = (Vec_Ptr_t *)pNtk->pData;
  iVar10 = 0;
  while (iVar10 < pNtk->vPis->nSize) {
    pAVar6 = Abc_NtkPi(pNtk,iVar10);
    iVar10 = iVar10 + 1;
    if (*(int *)((long)pAVar6->pNtk->vObjs->pArray[*(pAVar6->vFanouts).pArray] + 0x40) < 0) {
      __assert_fail("Abc_ObjFanout0(pTerm)->iTemp >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieCec.c"
                    ,0xbd,"void Abc_NtkDeriveFlatGia_rec(Gia_Man_t *, Abc_Ntk_t *)");
    }
  }
  iVar10 = 0;
  do {
    if (p->nSize <= iVar10) {
      iVar10 = 0;
      do {
        if (pNtk->vPos->nSize <= iVar10) {
          return;
        }
        pAVar6 = Abc_NtkPo(pNtk,iVar10);
        iVar10 = iVar10 + 1;
      } while (-1 < *(int *)((long)pAVar6->pNtk->vObjs->pArray[*(pAVar6->vFanins).pArray] + 0x40));
      __assert_fail("Abc_ObjFanin0(pTerm)->iTemp >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieCec.c"
                    ,0xf5,"void Abc_NtkDeriveFlatGia_rec(Gia_Man_t *, Abc_Ntk_t *)");
    }
    plVar7 = (long *)Vec_PtrEntry(p,iVar10);
    uVar3 = *(uint *)((long)plVar7 + 0x14) & 0xf;
    if (uVar3 == 7) {
      iVar5 = *(int *)((long)plVar7 + 0x1c);
      if (0x10 < iVar5) {
        __assert_fail("Abc_ObjFaninNum(pObj) <= 16",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieCec.c"
                      ,0xdb,"void Abc_NtkDeriveFlatGia_rec(Gia_Man_t *, Abc_Ntk_t *)");
      }
      pSop = (char *)plVar7[7];
      iVar4 = Abc_SopGetVarNum(pSop);
      if (iVar5 != iVar4) {
        __assert_fail("Abc_ObjFaninNum(pObj) == Abc_SopGetVarNum(pSop)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieCec.c"
                      ,0xdc,"void Abc_NtkDeriveFlatGia_rec(Gia_Man_t *, Abc_Ntk_t *)");
      }
      uVar8 = (ulong)*(uint *)((long)plVar7 + 0x1c);
      if ((int)*(uint *)((long)plVar7 + 0x1c) < 1) {
        uVar8 = 0;
      }
      uVar9 = 0;
      while (uVar8 != uVar9) {
        iVar5 = *(int *)(*(long *)(*(long *)(*(long *)(*plVar7 + 0x20) + 8) +
                                  (long)*(int *)(plVar7[4] + uVar9 * 4) * 8) + 0x40);
        local_78[uVar9] = iVar5;
        uVar9 = uVar9 + 1;
        if (iVar5 < 0) {
          __assert_fail("gFanins[k] >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieCec.c"
                        ,0xe0,"void Abc_NtkDeriveFlatGia_rec(Gia_Man_t *, Abc_Ntk_t *)");
        }
      }
      iVar5 = Abc_NtkDeriveFlatGiaSop(pGia,local_78,pSop);
      *(int *)(*(long *)(*(long *)(*(long *)(*plVar7 + 0x20) + 8) + (long)*(int *)plVar7[6] * 8) +
              0x40) = iVar5;
    }
    else {
      if (uVar3 != 10 && (*(uint *)((long)plVar7 + 0x14) & 0xe) != 8) {
        __assert_fail("Abc_ObjIsBox(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieCec.c"
                      ,0xe5,"void Abc_NtkDeriveFlatGia_rec(Gia_Man_t *, Abc_Ntk_t *)");
      }
      pNtk_00 = (Abc_Ntk_t *)plVar7[7];
      Abc_NtkFillTemp(pNtk_00);
      iVar5 = *(int *)((long)plVar7 + 0x1c);
      if (iVar5 != pNtk_00->vPis->nSize) {
        __assert_fail("Abc_ObjFaninNum(pObj) == Abc_NtkPiNum(pNtkModel)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieCec.c"
                      ,0xe9,"void Abc_NtkDeriveFlatGia_rec(Gia_Man_t *, Abc_Ntk_t *)");
      }
      if (*(int *)((long)plVar7 + 0x2c) != pNtk_00->vPos->nSize) {
        __assert_fail("Abc_ObjFanoutNum(pObj) == Abc_NtkPoNum(pNtkModel)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieCec.c"
                      ,0xea,"void Abc_NtkDeriveFlatGia_rec(Gia_Man_t *, Abc_Ntk_t *)");
      }
      for (lVar11 = 0; lVar11 < iVar5; lVar11 = lVar11 + 1) {
        plVar2 = *(long **)(*(long *)(*(long *)(*plVar7 + 0x20) + 8) +
                           (long)*(int *)(plVar7[4] + lVar11 * 4) * 8);
        uVar1 = *(undefined4 *)
                 (*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[4] * 8)
                 + 0x40);
        pAVar6 = Abc_NtkPi(pNtk_00,(int)lVar11);
        *(undefined4 *)((long)pAVar6->pNtk->vObjs->pArray[*(pAVar6->vFanouts).pArray] + 0x40) =
             uVar1;
        iVar5 = *(int *)((long)plVar7 + 0x1c);
      }
      Abc_NtkDeriveFlatGia_rec(pGia,pNtk_00);
      for (lVar11 = 0; lVar11 < *(int *)((long)plVar7 + 0x2c); lVar11 = lVar11 + 1) {
        plVar2 = *(long **)(*(long *)(*(long *)(*plVar7 + 0x20) + 8) +
                           (long)*(int *)(plVar7[6] + lVar11 * 4) * 8);
        pAVar6 = Abc_NtkPo(pNtk_00,(int)lVar11);
        *(undefined4 *)
         (*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[6] * 8) + 0x40)
             = *(undefined4 *)((long)pAVar6->pNtk->vObjs->pArray[*(pAVar6->vFanins).pArray] + 0x40);
      }
    }
    iVar10 = iVar10 + 1;
  } while( true );
}

Assistant:

void Abc_NtkDeriveFlatGia_rec( Gia_Man_t * pGia, Abc_Ntk_t * pNtk )
{
    int gFanins[16];
    Vec_Ptr_t * vOrder = (Vec_Ptr_t *)pNtk->pData;
    Abc_Obj_t * pObj, * pTerm;
    Abc_Ntk_t * pNtkModel;
    int i, k;
    Abc_NtkForEachPi( pNtk, pTerm, i )
        assert( Abc_ObjFanout0(pTerm)->iTemp >= 0 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vOrder, pObj, i )
    {
        if ( Abc_ObjIsNode(pObj) )
        {
            char * pSop = (char *)pObj->pData;
/*
            int nLength = strlen(pSop);
            if ( nLength == 4 ) // buf/inv
            {
                assert( pSop[2] == '1' );
                assert( pSop[0] == '0' || pSop[0] == '1' );
                assert( Abc_ObjFanin0(pObj)->iTemp >= 0 );
                Abc_ObjFanout0(pObj)->iTemp = Abc_LitNotCond( Abc_ObjFanin0(pObj)->iTemp, pSop[0]=='0' );
                continue;
            }
            if ( nLength == 5 ) // and2
            {
                assert( pSop[3] == '1' );
                assert( pSop[0] == '0' || pSop[0] == '1' );
                assert( pSop[1] == '0' || pSop[1] == '1' );
                assert( Abc_ObjFanin0(pObj)->iTemp >= 0 );
                assert( Abc_ObjFanin1(pObj)->iTemp >= 0 );
                Abc_ObjFanout0(pObj)->iTemp = Gia_ManHashAnd( pGia, 
                    Abc_LitNotCond( Abc_ObjFanin0(pObj)->iTemp, pSop[0]=='0' ),
                    Abc_LitNotCond( Abc_ObjFanin1(pObj)->iTemp, pSop[1]=='0' )
                    );
                continue;
            }
*/
            assert( Abc_ObjFaninNum(pObj) <= 16 );
            assert( Abc_ObjFaninNum(pObj) == Abc_SopGetVarNum(pSop) );
            Abc_ObjForEachFanin( pObj, pTerm, k )
            {
                gFanins[k] = pTerm->iTemp;
                assert( gFanins[k] >= 0 );
            }
            Abc_ObjFanout0(pObj)->iTemp = Abc_NtkDeriveFlatGiaSop( pGia, gFanins, pSop );
            continue;
        }
        assert( Abc_ObjIsBox(pObj) );
        pNtkModel = (Abc_Ntk_t *)pObj->pData;
        Abc_NtkFillTemp( pNtkModel );
        // check the match between the number of actual and formal parameters
        assert( Abc_ObjFaninNum(pObj) == Abc_NtkPiNum(pNtkModel) );
        assert( Abc_ObjFanoutNum(pObj) == Abc_NtkPoNum(pNtkModel) );
        // assign PIs
        Abc_ObjForEachFanin( pObj, pTerm, k )
            Abc_ObjFanout0( Abc_NtkPi(pNtkModel, k) )->iTemp = Abc_ObjFanin0(pTerm)->iTemp;
        // call recursively
        Abc_NtkDeriveFlatGia_rec( pGia, pNtkModel );
        // assign POs
        Abc_ObjForEachFanout( pObj, pTerm, k )
            Abc_ObjFanout0(pTerm)->iTemp = Abc_ObjFanin0( Abc_NtkPo(pNtkModel, k) )->iTemp;
    }
    Abc_NtkForEachPo( pNtk, pTerm, i )
        assert( Abc_ObjFanin0(pTerm)->iTemp >= 0 );
}